

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestStackRealloc.cpp
# Opt level: O2

void __thiscall TestVariableImportCorrectness::Run(TestVariableImportCorrectness *this)

{
  bool bVar1;
  int t;
  long lVar2;
  
  nullcTerminate();
  nullcInit();
  nullcAddImportPath("Modules/");
  nullcAddImportPath("../Modules/");
  nullcSetFileReadHandler(Tests::fileLoadFunc,Tests::fileFreeFunc);
  nullcSetEnableLogFiles
            ((uint)Tests::enableLogFiles,(_func_void_ptr_char_ptr *)Tests::openStreamFunc,
             (_func_void_void_ptr_char_ptr_uint *)Tests::writeStreamFunc,
             (_func_void_void_ptr *)Tests::closeStreamFunc);
  nullcSetEnableTimeTrace((uint)Tests::enableTimeTrace);
  nullcInitDynamicModule();
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    if ((&Tests::testExecutor)[lVar2] == '\x01') {
      testsCount[lVar2] = testsCount[lVar2] + 1;
      bVar1 = Tests::RunCodeSimple
                        ("import std.dynamic;\r\nint x = 2;\r\neval(\"x = 4;\");\r\n{ int n, m; }\r\nint y = 3;\r\neval(\"y = 8;\");\r\nreturn x * 10 + y;"
                         ,testTarget[lVar2],"48","Variable import correctness [skip_c]",false,"");
      if (bVar1) {
        testsPassed[lVar2] = testsPassed[lVar2] + 1;
      }
    }
  }
  return;
}

Assistant:

virtual void Run()
	{
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitDynamicModule();

		const char	*testVariableImportCorrectness =
"import std.dynamic;\r\n\
int x = 2;\r\n\
eval(\"x = 4;\");\r\n\
{ int n, m; }\r\n\
int y = 3;\r\n\
eval(\"y = 8;\");\r\n\
return x * 10 + y;";
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testExecutor[t])
				continue;

			testsCount[t]++;
			if(Tests::RunCodeSimple(testVariableImportCorrectness, testTarget[t], "48", "Variable import correctness [skip_c]", false, ""))
				testsPassed[t]++;
		}
	}